

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

token * __thiscall libchars::commands::find_arg(commands *this,id_t ID)

{
  bool bVar1;
  commands *local_28;
  token *T;
  id_t ID_local;
  commands *this_local;
  
  if (this->cmd == (command *)0x0) {
    this_local = (commands *)0x0;
  }
  else if (ID == -1) {
    this_local = (commands *)0x0;
  }
  else {
    local_28 = (commands *)this->t_par;
    while( true ) {
      bVar1 = false;
      if (local_28 != (commands *)0x0) {
        bVar1 = *(int *)((long)(local_28->super_edit_object).buffer + 0x60) != ID;
      }
      if (!bVar1) break;
      local_28 = *(commands **)((long)(local_28->super_edit_object).buffer + 0x80);
    }
    if ((local_28 != (commands *)0x0) &&
       (*(int *)((long)(local_28->super_edit_object).buffer + 0x38) == 2)) {
      if (*(long *)((long)(local_28->super_edit_object).buffer + 0x80) == 0) {
        return (token *)0x0;
      }
      if (*(int *)(*(long *)((long)(local_28->super_edit_object).buffer + 0x80) + 0x40) != 2) {
        return (token *)0x0;
      }
      if ((*(uint *)(*(long *)((long)(local_28->super_edit_object).buffer + 0x80) + 0x6c) & 0x800)
          == 0) {
        return (token *)0x0;
      }
    }
    this_local = local_28;
  }
  return (token *)this_local;
}

Assistant:

token *commands::find_arg(token::id_t ID)
    {
        if (cmd == NULL)
            return NULL;
        if (ID == token::ID_NOT_SET)
            return NULL;

        token *T = t_par;
        while (T != NULL && T->ID != ID)
            T = T->next;

        // special test case: {key,value} pair must have both components
        if (T != NULL && T->ttype == token::KEY) {
            if (T->next == NULL)
                return NULL; // {key,value} pair missing 'value'
            else if (T->next->ttype != token::KEY)
                return NULL; // {key,value} pair missing 'value'
            else if (!(T->next->status & token::IS_VALUE))
                return NULL; // {key,value} pair invalid 'value'
        }

        return T;
    }